

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O0

set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> * __thiscall
CfgNode::BlockData::calls
          (set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *__return_storage_ptr__,
          BlockData *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  iterator __i;
  insert_iterator<std::set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>_> iVar3;
  BlockData *this_local;
  set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *cfgCalls;
  
  std::set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>::set(__return_storage_ptr__)
  ;
  cVar1 = std::
          map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
          ::begin(&this->m_calls);
  cVar2 = std::
          map<unsigned_long,_CfgCall_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
          ::end(&this->m_calls);
  __i = std::set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>::begin
                  (__return_storage_ptr__);
  iVar3 = std::inserter<std::set<CfgCall*,std::less<CfgCall*>,std::allocator<CfgCall*>>>
                    (__return_storage_ptr__,__i);
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,CfgCall*>>,std::insert_iterator<std::set<CfgCall*,std::less<CfgCall*>,std::allocator<CfgCall*>>>,CfgNode::BlockData::calls()const::__0>
            (cVar1._M_node,cVar2._M_node,iVar3.container,iVar3.iter._M_node._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::set<CfgCall*> CfgNode::BlockData::calls() const {
	std::set<CfgCall*> cfgCalls;

	std::transform(m_calls.begin(), m_calls.end(),
			std::inserter(cfgCalls, cfgCalls.begin()),
			[](const std::map<Addr, CfgCall*>::value_type &pair) {
					return pair.second;
			}
	);

	return cfgCalls;
}